

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

void proto2_unittest::TestPackedExtensions::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  Nonnull<const_char_*> pcVar2;
  
  if (from_msg == to_msg) {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    google::protobuf::internal::ExtensionSet::MergeFrom
              ((ExtensionSet *)(to_msg + 1),(MessageLite *)_TestPackedExtensions_default_instance_,
               (ExtensionSet *)(from_msg + 1));
    uVar1 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar1 & 1) == 0) {
      return;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
    return;
  }
  MergeImpl();
}

Assistant:

void TestPackedExtensions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestPackedExtensions*>(&to_msg);
  auto& from = static_cast<const TestPackedExtensions&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestPackedExtensions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}